

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source.cc
# Opt level: O0

size_t __thiscall wabt::LexerSource::Fill(LexerSource *this,void *dest,Offset size)

{
  unsigned_long *puVar1;
  void *src;
  size_t local_28;
  Offset read_size;
  Offset size_local;
  void *dest_local;
  LexerSource *this_local;
  
  src = (void *)(this->size_ - this->read_offset_);
  read_size = size;
  size_local = (Offset)dest;
  dest_local = this;
  puVar1 = std::min<unsigned_long>(&read_size,(unsigned_long *)&src);
  local_28 = *puVar1;
  if (local_28 != 0) {
    memcpy((void *)size_local,(void *)((long)this->data_ + this->read_offset_),local_28);
    this->read_offset_ = local_28 + this->read_offset_;
  }
  return local_28;
}

Assistant:

size_t LexerSource::Fill(void* dest, Offset size) {
  Offset read_size = std::min(size, size_ - read_offset_);
  if (read_size > 0) {
    const void* src = static_cast<const char*>(data_) + read_offset_;
    memcpy(dest, src, read_size);
    read_offset_ += read_size;
  }
  return read_size;
}